

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
DensityCalculator<double,_float>::push_adj
          (DensityCalculator<double,_float> *this,size_t *counts,int ncat,int chosen_cat,
          ScoringMetric scoring_metric)

{
  int in_EDX;
  double pct_tree_left;
  int cat;
  size_t cnt;
  int cnt_cat;
  double in_stack_00000048;
  double in_stack_00000050;
  double in_stack_00000058;
  DensityCalculator<double,_float> *in_stack_00000060;
  undefined4 local_2c;
  
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
  }
  push_adj(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,(double)this,
           counts._4_4_);
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_adj(size_t *restrict counts, int ncat, int chosen_cat, ScoringMetric scoring_metric)
{
    /* this one assumes 'categ_present' has entries 0/1 for missing/present */
    int cnt_cat = 0;
    size_t cnt = 0;
    for (int cat = 0; cat < ncat; cat++)
    {
        cnt += counts[cat];
        cnt_cat += counts[cat] > 0;
    }

    double pct_tree_left = (ldouble_safe)counts[chosen_cat] / (ldouble_safe)cnt;
    this->push_adj(0., (double)cnt_cat, 1., pct_tree_left, scoring_metric);
}